

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

void __thiscall Pl_PNGFilter::decodeAverage(Pl_PNGFilter *this)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint local_2c;
  int up;
  int left;
  uint i;
  uint bpp;
  uchar *above_buffer;
  uchar *buffer;
  Pl_PNGFilter *this_local;
  
  QTC::TC("libtests","Pl_PNGFilter decodeAverage",0);
  puVar2 = this->cur_row;
  puVar3 = this->prev_row;
  uVar1 = this->bytes_per_pixel;
  for (up = 0; (uint)up < this->bytes_per_row; up = up + 1) {
    local_2c = 0;
    if (uVar1 <= (uint)up) {
      local_2c = (uint)puVar2[(ulong)(up - uVar1) + 1];
    }
    puVar2[(ulong)(uint)up + 1] =
         puVar2[(ulong)(uint)up + 1] + (char)((local_2c + puVar3[(ulong)(uint)up + 1]) / 2);
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodeAverage()
{
    QTC::TC("libtests", "Pl_PNGFilter decodeAverage");
    unsigned char* buffer = this->cur_row + 1;
    unsigned char* above_buffer = this->prev_row + 1;
    unsigned int bpp = this->bytes_per_pixel;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        int left = 0;
        int up = 0;

        if (i >= bpp) {
            left = buffer[i - bpp];
        }

        up = above_buffer[i];
        buffer[i] = static_cast<unsigned char>(buffer[i] + (left + up) / 2);
    }
}